

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void add_token(VARR_token_t *to,token_t t)

{
  ushort uVar1;
  node_code_t nVar2;
  char *pcVar3;
  node_t_conflict pnVar4;
  ulong uVar5;
  token_t *pptVar6;
  uint *puVar7;
  node_t_conflict n;
  token_t *in_RCX;
  char *extraout_RDX;
  c2m_ctx_t c2m_ctx;
  size_t sVar8;
  pos_t pos;
  
  if ((*(short *)t == 0x20) || (*(short *)t == 10)) {
    c2m_ctx = (c2m_ctx_t)to;
    if (to != (VARR_token_t *)0x0) {
      if (to->els_num != 0) {
        in_RCX = to->varr;
        if (in_RCX == (token_t *)0x0) goto LAB_0019628e;
        if (*(short *)in_RCX[to->els_num - 1] == 10) {
          return;
        }
        if (*(short *)in_RCX[to->els_num - 1] == 0x20) {
          return;
        }
      }
      goto LAB_00196239;
    }
  }
  else {
LAB_00196239:
    c2m_ctx = (c2m_ctx_t)to->varr;
    if (c2m_ctx != (c2m_ctx_t)0x0) {
      uVar5 = to->els_num + 1;
      if (to->size < uVar5) {
        sVar8 = (uVar5 >> 1) + uVar5;
        pptVar6 = (token_t *)realloc(c2m_ctx,sVar8 * 8);
        to->varr = pptVar6;
        to->size = sVar8;
      }
      sVar8 = to->els_num;
      to->els_num = sVar8 + 1;
      to->varr[sVar8] = t;
      return;
    }
    add_token_cold_3();
  }
  add_token_cold_2();
LAB_0019628e:
  add_token_cold_1();
  pcVar3 = t->repr;
  uVar1 = *(ushort *)t;
  nVar2 = t->node_code;
  puVar7 = (uint *)reg_malloc(c2m_ctx,0x30);
  *puVar7 = (uint)uVar1;
  *(char **)(puVar7 + 2) = extraout_RDX;
  *(token_t **)(puVar7 + 4) = in_RCX;
  *(char **)(puVar7 + 10) = pcVar3;
  puVar7[6] = nVar2;
  puVar7[8] = 0;
  puVar7[9] = 0;
  pnVar4 = t->node;
  if (pnVar4 != (node_t_conflict)0x0) {
    n = new_node(c2m_ctx,pnVar4->code);
    pos._8_8_ = in_RCX;
    pos.fname = extraout_RDX;
    set_node_pos(c2m_ctx,n,pos);
    sVar8 = (pnVar4->u).s.len;
    (n->u).s.s = (pnVar4->u).s.s;
    (n->u).s.len = sVar8;
    *(node_t_conflict *)(puVar7 + 8) = n;
  }
  return;
}

Assistant:

static void add_token (VARR (token_t) * to, token_t t) {
  if ((t->code != ' ' && t->code != '\n') || VARR_LENGTH (token_t, to) == 0
      || (VARR_LAST (token_t, to)->code != ' ' && VARR_LAST (token_t, to)->code != '\n'))
    VARR_PUSH (token_t, to, t);
}